

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5ParseSetColset(Fts5Parse *pParse,Fts5ExprNode *pExpr,Fts5Colset *pColset)

{
  Fts5Colset *in_RDX;
  Fts5Parse *in_RDI;
  long in_FS_OFFSET;
  Fts5Colset *pFree;
  Fts5ExprNode *pNode;
  
  pNode = *(Fts5ExprNode **)(in_FS_OFFSET + 0x28);
  if (in_RDI->pConfig->eDetail == 1) {
    sqlite3Fts5ParseError(in_RDI,"fts5: column queries are not supported (detail=none)");
  }
  else {
    fts5ParseSetColset((Fts5Parse *)pColset,pNode,in_RDX,(Fts5Colset **)in_RDI);
  }
  sqlite3_free((void *)0x26d2fe);
  if (*(Fts5ExprNode **)(in_FS_OFFSET + 0x28) == pNode) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void sqlite3Fts5ParseSetColset(
  Fts5Parse *pParse,
  Fts5ExprNode *pExpr,
  Fts5Colset *pColset
){
  Fts5Colset *pFree = pColset;
  if( pParse->pConfig->eDetail==FTS5_DETAIL_NONE ){
    sqlite3Fts5ParseError(pParse,
        "fts5: column queries are not supported (detail=none)"
    );
  }else{
    fts5ParseSetColset(pParse, pExpr, pColset, &pFree);
  }
  sqlite3_free(pFree);
}